

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void recvtftp(testcase *test,formats *pf)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  tftphdr *rap;
  tftphdr *rdp;
  long lStack_28;
  unsigned_short recvblock;
  ssize_t size;
  ssize_t n;
  formats *pf_local;
  testcase *test_local;
  
  rdp._6_2_ = 0;
  n = (ssize_t)pf;
  pf_local = (formats *)test;
  rap = w_init();
  mysignal(0xe,timer);
LAB_0010856b:
  timeout = 0;
  ackbuf.hdr.th_opcode = htons(4);
  ackbuf._2_2_ = htons(rdp._6_2_);
  rdp._6_2_ = rdp._6_2_ + 1;
  __sigsetjmp(timeoutbuf,1);
  do {
    sVar3 = send(peer,&ackbuf,4,0x4000);
    if (sVar3 != 4) {
      logmsg("write: fail\n");
      return;
    }
    write_behind((testcase *)pf_local,*(int *)(n + 8));
    do {
      do {
        alarm(5);
        size = recv(peer,rap,0x204,0);
        alarm(0);
        if (got_exit_signal != 0) {
          return;
        }
        if (size < 0) {
          logmsg("read: fail\n");
          return;
        }
        uVar1 = ntohs(rap->th_opcode);
        rap->th_opcode = uVar1;
        uVar1 = ntohs((rap->th_u1).th_u2.th_u3.tu_block);
        (rap->th_u1).th_u2.th_u3.tu_block = uVar1;
        if (rap->th_opcode == 5) {
          return;
        }
      } while (rap->th_opcode != 3);
      if ((rap->th_u1).th_u2.th_u3.tu_block == rdp._6_2_) {
        iVar2 = writeit((testcase *)pf_local,&rap,(int)size + -4,*(int *)(n + 8));
        lStack_28 = (long)iVar2;
        if (lStack_28 != size + -4) {
          if (lStack_28 < 0) {
            piVar4 = __errno_location();
            nak(*piVar4 + 100);
            return;
          }
          nak(3);
          return;
        }
        if (lStack_28 != 0x200) {
          write_behind((testcase *)pf_local,*(int *)(n + 8));
          ackbuf.hdr.th_opcode = htons(4);
          ackbuf._2_2_ = htons(rdp._6_2_);
          send(peer,&ackbuf,4,0x4000);
          mysignal(0xe,justtimeout);
          alarm(5);
          size = recv(peer,&buf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (size < 4) {
            return;
          }
          if (rap->th_opcode != 3) {
            return;
          }
          if (rdp._6_2_ != (rap->th_u1).th_u2.th_u3.tu_block) {
            return;
          }
          send(peer,&ackbuf,4,0x4000);
          return;
        }
        goto LAB_0010856b;
      }
      synchnet(peer);
    } while ((uint)(rap->th_u1).th_u2.th_u3.tu_block != rdp._6_2_ - 1);
  } while( true );
}

Assistant:

static void recvtftp(struct testcase *test, struct formats *pf)
{
  ssize_t n, size;
  /* These are volatile to live through a siglongjmp */
  volatile unsigned short recvblock; /* block count */
  struct tftphdr * volatile rdp;     /* data buffer */
  struct tftphdr *rap;      /* ack buffer */

  recvblock = 0;
  rdp = w_init();
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  rap = &ackbuf.hdr;
  do {
    timeout = 0;
    rap->th_opcode = htons((unsigned short)opcode_ACK);
    rap->th_block = htons(recvblock);
    recvblock++;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
send_ack:
    if(swrite(peer, &ackbuf.storage[0], 4) != 4) {
      logmsg("write: fail\n");
      goto abort;
    }
    write_behind(test, pf->f_convert);
    for(;;) {
#ifdef HAVE_ALARM
      alarm(rexmtval);
#endif
      n = sread(peer, rdp, PKTSIZE);
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        goto abort;
      if(n < 0) {                       /* really? */
        logmsg("read: fail\n");
        goto abort;
      }
      rdp->th_opcode = ntohs((unsigned short)rdp->th_opcode);
      rdp->th_block = ntohs(rdp->th_block);
      if(rdp->th_opcode == opcode_ERROR)
        goto abort;
      if(rdp->th_opcode == opcode_DATA) {
        if(rdp->th_block == recvblock) {
          break;                         /* normal */
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if(rdp->th_block == (recvblock-1))
          goto send_ack;                 /* rexmit */
      }
    }

    size = writeit(test, &rdp, (int)(n - 4), pf->f_convert);
    if(size != (n-4)) {                 /* ahem */
      if(size < 0)
        nak(errno + 100);
      else
        nak(ENOSPACE);
      goto abort;
    }
  } while(size == SEGSIZE);
  write_behind(test, pf->f_convert);

  rap->th_opcode = htons((unsigned short)opcode_ACK);  /* send the "final"
                                                          ack */
  rap->th_block = htons(recvblock);
  (void) swrite(peer, &ackbuf.storage[0], 4);
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, justtimeout);        /* just abort read on timeout */
  alarm(rexmtval);
#endif
  /* normally times out and quits */
  n = sread(peer, &buf.storage[0], sizeof(buf.storage));
#ifdef HAVE_ALARM
  alarm(0);
#endif
  if(got_exit_signal)
    goto abort;
  if(n >= 4 &&                               /* if read some data */
     rdp->th_opcode == opcode_DATA &&        /* and got a data block */
     recvblock == rdp->th_block) {           /* then my last ack was lost */
    (void) swrite(peer, &ackbuf.storage[0], 4);  /* resend final ack */
  }
abort:
  return;
}